

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O0

void __thiscall SharedMatting::gathering(SharedMatting *this)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference b_00;
  reference pPVar5;
  Point PVar6;
  Point_<int> local_1f0;
  Point_<int> local_1e8;
  Scalar_<double> local_1e0;
  Scalar_<double> local_1c0;
  uint local_19c;
  uint local_198;
  int rc;
  int gc;
  int bc;
  Tuple st;
  Point_<int> local_130;
  Point_<int> local_128;
  Point local_120;
  double gp;
  Point_<int> *local_110;
  Point_<int> local_108;
  Point_<int> local_100;
  double local_f8;
  double dpf;
  Point_<int> *local_e8;
  undefined1 local_da;
  byte local_d9;
  int local_d8;
  bool first;
  int iStack_d4;
  bool flag;
  Point tb;
  Point tf;
  double gmin;
  double local_b8;
  double pfp;
  int j;
  int i;
  int m;
  int size;
  double a;
  int index;
  undefined1 local_88 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  B;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  F;
  iterator it2;
  iterator it1;
  iterator it;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> b;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> f;
  SharedMatting *this_local;
  
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
             &b.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&it);
  __gnu_cxx::
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  ::__normal_iterator(&it1);
  __gnu_cxx::
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  ::__normal_iterator(&it2);
  __gnu_cxx::
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  ::__normal_iterator((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                       *)&F.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &B.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)this_00);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_88);
  Sample(this,(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)this_00,
         (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *)local_88);
  a._0_4_ = 0;
  sVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(&this->uT);
  i = (int)sVar2;
  for (j = 0; j < i; j = j + 1) {
    pvVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       (&this->uT,(long)j);
    pfp._4_4_ = pvVar3->x;
    pvVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       (&this->uT,(long)j);
    pfp._0_4_ = pvVar3->y;
    cv::Point_<int>::Point_((Point_<int> *)&gmin,pfp._4_4_,pfp._0_4_);
    pvVar4 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           *)&B.
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j);
    b_00 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)local_88,(long)j);
    local_b8 = pfP(this,(Point *)&gmin,pvVar4,b_00);
    tf.x = 0x20000000;
    tf.y = 0x4202a05f;
    cv::Point_<int>::Point_(&tb);
    cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffff28);
    local_d9 = 0;
    local_da = 1;
    pvVar4 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           *)&B.
                              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j);
    local_e8 = (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin(pvVar4);
    it2 = (iterator)local_e8;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             *)&B.
                                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j);
      dpf = (double)std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=
                        (&it2,(__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                               *)&dpf);
      if (!bVar1) break;
      cv::Point_<int>::Point_(&local_100,pfp._4_4_,pfp._0_4_);
      pPVar5 = __gnu_cxx::
               __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
               ::operator*(&it2);
      cv::Point_<int>::Point_(&local_108,pPVar5);
      local_f8 = dP(this,&local_100,&local_108);
      pvVar4 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             *)local_88,(long)j);
      local_110 = (Point_<int> *)
                  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin(pvVar4);
      F.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_110;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               *)local_88,(long)j);
        gp = (double)std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end(pvVar4);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                            *)&F.
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                            *)&gp);
        if (!bVar1) break;
        cv::Point_<int>::Point_(&local_128,pfp._4_4_,pfp._0_4_);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                 ::operator*(&it2);
        cv::Point_<int>::Point_(&local_130,pPVar5);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                 ::operator*((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                              *)&F.
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::Point_<int>::Point_((Point_<int> *)&st.flag,pPVar5);
        PVar6 = (Point)gP(this,&local_128,&local_130,(Point *)&st.flag,local_f8,local_b8);
        local_120 = PVar6;
        if ((double)PVar6 < (double)tf) {
          pPVar5 = __gnu_cxx::
                   __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                   ::operator*(&it2);
          cv::Point_<int>::operator=(&tb,pPVar5);
          pPVar5 = __gnu_cxx::
                   __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                   ::operator*((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                                *)&F.
                                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cv::Point_<int>::operator=((Point_<int> *)&stack0xffffffffffffff28,pPVar5);
          local_d9 = 1;
          tf = PVar6;
        }
        __gnu_cxx::
        __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
        ::operator++((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                      *)&F.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      __gnu_cxx::
      __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
      ::operator++(&it2);
    }
    Tuple::Tuple((Tuple *)&gc);
    st.sigmab._0_4_ = 0xffffffff;
    if ((local_d9 & 1) != 0) {
      rc = (int)this->data[tb.x * this->step + tb.y * this->channels];
      local_198 = (uint)this->data[(long)(tb.x * this->step + tb.y * this->channels) + 1];
      local_19c = (uint)this->data[(long)(tb.x * this->step + tb.y * this->channels) + 2];
      st.sigmab._0_4_ = 1;
      cv::Scalar_<double>::Scalar_(&local_1c0,(double)rc,(double)local_198,(double)local_19c,0.0);
      cv::Scalar_<double>::operator=((Scalar_<double> *)&gc,&local_1c0);
      rc = (int)this->data[local_d8 * this->step + iStack_d4 * this->channels];
      local_198 = (uint)this->data[(long)(local_d8 * this->step + iStack_d4 * this->channels) + 1];
      local_19c = (uint)this->data[(long)(local_d8 * this->step + iStack_d4 * this->channels) + 2];
      cv::Scalar_<double>::Scalar_(&local_1e0,(double)rc,(double)local_198,(double)local_19c,0.0);
      cv::Scalar_<double>::operator=
                ((Scalar_<double> *)(st.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
                 &local_1e0);
      cv::Point_<int>::Point_(&local_1e8,&tb);
      st.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = sigma2(this,&local_1e8);
      cv::Point_<int>::Point_(&local_1f0,(Point_<int> *)&stack0xffffffffffffff28);
      st.sigmaf = sigma2(this,&local_1f0);
    }
    std::vector<Tuple,_std::allocator<Tuple>_>::push_back(&this->tuples,(value_type *)&gc);
    this->unknownIndex[pfp._4_4_][pfp._0_4_] = a._0_4_;
    a._0_4_ = a._0_4_ + 1;
  }
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
             &b.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&it);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_88);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)&B.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&it);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
             &b.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void SharedMatting::gathering()
{
    vector<Point> f;
    vector<Point> b;
    vector<Point>::iterator it;
    vector<Point>::iterator it1;
    vector<Point>::iterator it2;

    vector<vector<Point> > F,B;


    Sample(F, B);

    int index = 0;
    double a;
    int size = uT.size();

    for (int m = 0; m < size; ++m)
    {
        int i = uT[m].x;
        int j = uT[m].y;

        /*f.clear();
        b.clear();*/

        //sample(Point(i, j), f, b);

        /*double pfp = pfP(Point(i, j), f, b);*/

        double pfp = pfP(Point(i, j), F[m], B[m]);
        double gmin = 1.0e10;

        Point tf;
        Point tb;

        bool flag = false;
        bool first = true;

        for (it1 = F[m].begin(); it1 != F[m].end(); ++it1)
        {
            double dpf = dP(Point(i, j), *(it1));
            for (it2 = B[m].begin(); it2 < B[m].end(); ++it2)
            {

                double gp = gP(Point(i, j), *(it1), *(it2), dpf, pfp);
                if (gp < gmin)
                {
                    gmin = gp;
                    tf   = *(it1);
                    tb   = *(it2);
                    flag = true;
                }
            }
        }

        struct Tuple st;
        st.flag = -1;
        if (flag)
        {
            int bc, gc, rc;
            bc = data[tf.x * step +  tf.y * channels];
            gc = data[tf.x * step +  tf.y * channels + 1];
            rc = data[tf.x * step +  tf.y * channels + 2];
            st.flag   = 1;
            st.f      = Scalar(bc, gc, rc);
            bc = data[tb.x * step +  tb.y * channels];
            gc = data[tb.x * step +  tb.y * channels + 1];
            rc = data[tb.x * step +  tb.y * channels + 2];
            st.b      = Scalar(bc, gc, rc);
            st.sigmaf = sigma2(tf);
            st.sigmab = sigma2(tb);
        }

        tuples.push_back(st);
        unknownIndex[i][j] = index;
        ++index;
    }
    f.clear();
    b.clear();

}